

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,ScalarFunction *function)

{
  CreateScalarFunctionInfo info;
  ScalarFunction local_2f0;
  CreateScalarFunctionInfo local_1c8;
  
  ScalarFunction::ScalarFunction(&local_2f0,function);
  CreateScalarFunctionInfo::CreateScalarFunctionInfo(&local_1c8,&local_2f0);
  ScalarFunction::~ScalarFunction(&local_2f0);
  local_1c8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateFunction(this->catalog,this->transaction,&local_1c8.super_CreateFunctionInfo);
  CreateScalarFunctionInfo::~CreateScalarFunctionInfo(&local_1c8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(ScalarFunction function) {
	CreateScalarFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}